

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lz4hc.c
# Opt level: O2

int LZ4_loadDictHC(LZ4_streamHC_t *LZ4_streamHCPtr,char *dictionary,int dictSize)

{
  ushort uVar1;
  LZ4_byte *pLVar2;
  ushort uVar3;
  uint uVar4;
  ushort uVar5;
  uint uVar6;
  ulong uVar7;
  int iVar8;
  ulong uVar9;
  uint uVar10;
  LZ4_streamHC_t *LZ4_streamHCPtr_1;
  BYTE *start;
  
  iVar8 = 0x10000;
  if (dictSize < 0x10000) {
    iVar8 = dictSize;
  }
  start = (BYTE *)(dictionary + ((ulong)(uint)dictSize - 0x10000));
  if (dictSize < 0x10001) {
    start = (BYTE *)dictionary;
  }
  uVar1 = (LZ4_streamHCPtr->internal_donotuse).compressionLevel;
  if (((ulong)LZ4_streamHCPtr & 7) == 0 && LZ4_streamHCPtr != (LZ4_streamHC_t *)0x0) {
    memset(LZ4_streamHCPtr,0,0x40030);
  }
  uVar3 = 0xc;
  if (uVar1 < 0xc) {
    uVar3 = uVar1;
  }
  uVar5 = 9;
  if (0 < (short)uVar1) {
    uVar5 = uVar3;
  }
  (LZ4_streamHCPtr->internal_donotuse).compressionLevel = uVar5;
  LZ4HC_init_internal(&LZ4_streamHCPtr->internal_donotuse,start);
  LZ4_streamHCPtr->table[0x8000] = start + iVar8;
  if (3 < dictSize) {
    pLVar2 = (LZ4_streamHCPtr->internal_donotuse).base;
    uVar4 = ((int)(start + iVar8) - (int)pLVar2) - 3;
    for (uVar7 = (ulong)(LZ4_streamHCPtr->internal_donotuse).nextToUpdate; uVar7 < uVar4;
        uVar7 = uVar7 + 1) {
      uVar9 = (ulong)((uint)(*(int *)(pLVar2 + uVar7) * -0x61c8864f) >> 0x11);
      uVar6 = (uint)uVar7;
      uVar10 = uVar6 - *(int *)((long)LZ4_streamHCPtr + uVar9 * 4);
      if (0xfffe < uVar10) {
        uVar10 = 0xffff;
      }
      *(short *)((long)LZ4_streamHCPtr + (ulong)(uVar6 & 0xffff) * 2 + 0x20000) = (short)uVar10;
      *(uint *)((long)LZ4_streamHCPtr + uVar9 * 4) = uVar6;
    }
    (LZ4_streamHCPtr->internal_donotuse).nextToUpdate = uVar4;
  }
  return iVar8;
}

Assistant:

int LZ4_loadDictHC (LZ4_streamHC_t* LZ4_streamHCPtr,
              const char* dictionary, int dictSize)
{
    LZ4HC_CCtx_internal* const ctxPtr = &LZ4_streamHCPtr->internal_donotuse;
    DEBUGLOG(4, "LZ4_loadDictHC(ctx:%p, dict:%p, dictSize:%d)", LZ4_streamHCPtr, dictionary, dictSize);
    assert(LZ4_streamHCPtr != NULL);
    if (dictSize > 64 KB) {
        dictionary += (size_t)dictSize - 64 KB;
        dictSize = 64 KB;
    }
    /* need a full initialization, there are bad side-effects when using resetFast() */
    {   int const cLevel = ctxPtr->compressionLevel;
        LZ4_initStreamHC(LZ4_streamHCPtr, sizeof(*LZ4_streamHCPtr));
        LZ4_setCompressionLevel(LZ4_streamHCPtr, cLevel);
    }
    LZ4HC_init_internal (ctxPtr, (const BYTE*)dictionary);
    ctxPtr->end = (const BYTE*)dictionary + dictSize;
    if (dictSize >= 4) LZ4HC_Insert (ctxPtr, ctxPtr->end-3);
    return dictSize;
}